

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O2

dropt_char * dropt_ssfinalize(dropt_stringstream *ss)

{
  dropt_char *pdVar1;
  
  if (ss != (dropt_stringstream *)0x0) {
    dropt_ssresize(ss,0);
    pdVar1 = ss->string;
    ss->string = (dropt_char *)0x0;
    dropt_ssclose(ss);
    return pdVar1;
  }
  __assert_fail("ss != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                ,0x24d,"dropt_char *dropt_ssfinalize(dropt_stringstream *)");
}

Assistant:

dropt_char*
dropt_ssfinalize(dropt_stringstream* ss)
{
    dropt_char* s;
    assert(ss != NULL);

    /* Shrink to fit. */
    dropt_ssresize(ss, 0);

    s = ss->string;
    ss->string = NULL;

    dropt_ssclose(ss);

    return s;
}